

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_smoothStep_vec3(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  int i;
  long lVar3;
  float fVar4;
  float fVar5;
  Vector<float,_3> res;
  undefined8 local_40;
  float local_38;
  float local_30;
  undefined8 local_2c;
  float local_24;
  undefined8 local_20;
  int aiStack_18 [6];
  
  local_24 = c->in[0].m_data[2];
  local_20 = *(undefined8 *)c->in[0].m_data;
  local_40 = *(undefined8 *)(c->in[1].m_data + 1);
  local_38 = c->in[1].m_data[0];
  local_30 = c->in[2].m_data[3];
  local_2c = *(undefined8 *)(c->in[2].m_data + 1);
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  lVar3 = 0;
  do {
    fVar4 = (&local_24)[lVar3];
    fVar1 = (&local_30)[lVar3];
    fVar5 = 0.0;
    if ((fVar4 < fVar1) &&
       (fVar2 = *(float *)((long)&local_40 + lVar3 * 4), fVar5 = 1.0, fVar1 < fVar2)) {
      fVar4 = (fVar1 - fVar4) / (fVar2 - fVar4);
      fVar5 = (3.0 - (fVar4 + fVar4)) * fVar4 * fVar4;
    }
    res.m_data[lVar3] = fVar5;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar3 = 2;
  do {
    (c->color).m_data[aiStack_18[lVar3]] = res.m_data[lVar3 + -2];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

Vector<T, 3>			swizzle		(int a, int b, int c) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); return Vector<T, 3>(m_data[a], m_data[b], m_data[c]); }